

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peigstubs.c
# Opt level: O2

void pnga_diag_reuse(Integer reuse,Integer g_a,Integer g_s,Integer g_v,DoublePrecision *eval)

{
  pnga_error("ga_diag:peigs not interfaced",0);
  return;
}

Assistant:

void pnga_diag_reuse(Integer reuse, Integer g_a, Integer g_s, 
		   Integer g_v, DoublePrecision *eval) {
#if ENABLE_PEIGS
#   if ENABLE_F77
    gai_diag_reuse_(&reuse, &g_a, &g_s, &g_v, eval);
#   else
    pnga_error("ga_diag:peigs interfaced, need to configure --enable-f77",0L);
#   endif
#else
    pnga_error("ga_diag:peigs not interfaced",0L);
#endif
}